

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnImportTable
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index table_index,Type elem_type,Limits *elem_limits)

{
  Module *this_00;
  char *__s;
  Offset OVar1;
  uint64_t uVar2;
  size_t sVar3;
  pointer __p;
  undefined1 local_80 [8];
  string_view module_name_local;
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  string_view field_name_local;
  long local_38;
  
  module_name_local.data_ = (char *)module_name.size_;
  local_80 = (undefined1  [8])module_name.data_;
  field_name_local.data_ = (char *)field_name.size_;
  local_50 = (undefined1  [8])field_name.data_;
  MakeUnique<wabt::TableImport>();
  string_view::to_string_abi_cxx11_((string *)&module_name_local.size_,(string_view *)local_80);
  std::__cxx11::string::operator=((string *)(local_38 + 8),(string *)&module_name_local.size_);
  if ((undefined1 *)module_name_local.size_ != local_60) {
    operator_delete((void *)module_name_local.size_);
  }
  string_view::to_string_abi_cxx11_((string *)&module_name_local.size_,(string_view *)local_50);
  std::__cxx11::string::operator=((string *)(local_38 + 0x28),(string *)&module_name_local.size_);
  if ((undefined1 *)module_name_local.size_ != local_60) {
    operator_delete((void *)module_name_local.size_);
  }
  *(undefined2 *)(local_38 + 0x80) = *(undefined2 *)&elem_limits->has_max;
  uVar2 = elem_limits->max;
  *(uint64_t *)(local_38 + 0x70) = elem_limits->initial;
  *(uint64_t *)(local_38 + 0x78) = uVar2;
  this_00 = this->module_;
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar3 = strlen(__s);
  field_name_local.size_ = (size_type)operator_new(0x48);
  *(undefined8 *)(field_name_local.size_ + 8) = 0;
  *(undefined8 *)(field_name_local.size_ + 0x10) = 0;
  *(char **)(field_name_local.size_ + 0x18) = __s;
  *(size_t *)(field_name_local.size_ + 0x20) = sVar3;
  *(Offset *)(field_name_local.size_ + 0x28) = OVar1;
  *(undefined4 *)(field_name_local.size_ + 0x30) = 0;
  *(undefined4 *)(field_name_local.size_ + 0x38) = 2;
  *(undefined ***)field_name_local.size_ = &PTR__ImportModuleField_015445b8;
  *(long *)(field_name_local.size_ + 0x40) = local_38;
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&field_name_local.size_);
  if (field_name_local.size_ != 0) {
    (**(code **)(*(long *)field_name_local.size_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportTable(Index import_index,
                                     string_view module_name,
                                     string_view field_name,
                                     Index table_index,
                                     Type elem_type,
                                     const Limits* elem_limits) {
  auto import = MakeUnique<TableImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->table.elem_limits = *elem_limits;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}